

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  istream *piVar10;
  ggml_context *ctx;
  ggml_cgraph *gf;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  yolo_model model;
  vector<yolo_image,_std::allocator<yolo_image>_> alphabet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  yolo_params params;
  size_type __dnew;
  undefined4 uVar18;
  undefined4 uVar19;
  yolo_model local_360;
  value_type local_328;
  ulong local_308;
  long local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  yolo_image local_2e0;
  yolo_params local_2b8;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  size_type local_238 [4];
  uint auStack_218 [122];
  
  ggml_time_init();
  local_360.width = 0x1a0;
  local_360.height = 0x1a0;
  local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_start = (conv2d_layer *)0x0;
  local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.backend = (ggml_backend_t)0x0;
  local_2b8.thresh = 0.5;
  local_2b8.model._M_dataplus._M_p = (pointer)&local_2b8.model.field_2;
  local_238[0] = 0x10;
  local_2b8.model._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8.model,(ulong)local_238);
  local_2b8.fname_inp._M_dataplus._M_p = (pointer)&local_2b8.fname_inp.field_2;
  local_2b8.model.field_2._M_allocated_capacity = local_238[0];
  builtin_strncpy(local_2b8.model._M_dataplus._M_p,"yolov3-tiny.gguf",0x10);
  local_2b8.model._M_string_length = local_238[0];
  local_2b8.model._M_dataplus._M_p[local_238[0]] = '\0';
  local_2b8.fname_inp.field_2._M_allocated_capacity = 0x706a2e7475706e69;
  local_2b8.fname_inp.field_2._8_2_ = 0x67;
  local_2b8.fname_inp._M_string_length = 9;
  local_2b8.fname_out._M_dataplus._M_p = (pointer)&local_2b8.fname_out.field_2;
  local_2b8.fname_out.field_2._M_allocated_capacity._0_7_ = 0x74636964657270;
  local_2b8.fname_out.field_2._M_local_buf[7] = 'i';
  local_2b8.fname_out.field_2._8_7_ = 0x67706a2e736e6f;
  local_2b8.fname_out._M_string_length = 0xf;
  local_2b8.fname_out.field_2._M_local_buf[0xf] = '\0';
  yolo_params_parse(argc,argv,&local_2b8);
  if (local_360.backend == (ggml_backend_t)0x0) {
    local_360.backend = (ggml_backend_t)ggml_backend_cpu_init();
  }
  local_328._M_dataplus._M_p = (pointer)0x0;
  lVar6 = gguf_init_from_file(local_2b8.model._M_dataplus._M_p,0);
  if (lVar6 == 0) {
    main_cold_1();
  }
  else {
    uVar5 = gguf_get_n_tensors(lVar6);
    local_2e0._0_8_ = ggml_tensor_overhead();
    local_2e0._0_8_ = local_2e0._0_8_ * (long)(int)uVar5;
    local_2e0._8_8_ = 0;
    local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)CONCAT71(local_2e0.data.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,1);
    local_360.ctx = (ggml_context *)ggml_init();
    if (0 < (int)uVar5) {
      uVar17 = 0;
      do {
        uVar7 = gguf_get_tensor_name(lVar6,uVar17);
        uVar8 = ggml_get_tensor(local_328._M_dataplus._M_p,uVar7);
        uVar8 = ggml_dup_tensor(local_360.ctx,uVar8);
        ggml_set_name(uVar8,uVar7);
        uVar17 = uVar17 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar17);
    }
    local_360.buffer =
         (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(local_360.ctx,local_360.backend);
    for (lVar9 = ggml_get_first_tensor(local_360.ctx); _Var1._M_p = local_328._M_dataplus._M_p,
        lVar9 != 0; lVar9 = ggml_get_next_tensor(local_360.ctx,lVar9)) {
      uVar7 = ggml_get_name(lVar9);
      uVar7 = ggml_get_tensor(_Var1._M_p,uVar7);
      ggml_nbytes(uVar7);
      uVar7 = ggml_get_data(uVar7);
      ggml_backend_tensor_set(lVar9,uVar7,0);
    }
    gguf_free(lVar6);
    local_360.width = 0x1a0;
    local_360.height = 0x1a0;
    std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::resize(&local_360.conv2d_layers,0xd);
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[7].padding = 0;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].padding = 0;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].batch_normalize = false;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].activate = false;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[10].padding = 0;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].padding = 0;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].batch_normalize = false;
    local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].activate = false;
    if (0 < (int)((ulong)((long)local_360.conv2d_layers.
                                super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
      lVar9 = 0;
      uVar17 = 0;
      do {
        snprintf((char *)local_238,0x100,"l%d_weights",uVar17 & 0xffffffff);
        uVar7 = ggml_get_tensor(local_360.ctx,local_238);
        *(undefined8 *)
         ((long)&(local_360.conv2d_layers.
                  super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                  super__Vector_impl_data._M_start)->weights + lVar9) = uVar7;
        snprintf((char *)local_238,0x100,"l%d_biases",uVar17 & 0xffffffff);
        uVar7 = ggml_get_tensor(local_360.ctx,local_238);
        *(undefined8 *)
         ((long)&(local_360.conv2d_layers.
                  super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                  super__Vector_impl_data._M_start)->biases + lVar9) = uVar7;
        if ((&(local_360.conv2d_layers.
               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
               super__Vector_impl_data._M_start)->batch_normalize)[lVar9] == true) {
          snprintf((char *)local_238,0x100,"l%d_scales",uVar17 & 0xffffffff);
          uVar7 = ggml_get_tensor(local_360.ctx,local_238);
          *(undefined8 *)
           ((long)&(local_360.conv2d_layers.
                    super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                    super__Vector_impl_data._M_start)->scales + lVar9) = uVar7;
          snprintf((char *)local_238,0x100,"l%d_rolling_mean",uVar17 & 0xffffffff);
          uVar7 = ggml_get_tensor(local_360.ctx,local_238);
          *(undefined8 *)
           ((long)&(local_360.conv2d_layers.
                    super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                    super__Vector_impl_data._M_start)->rolling_mean + lVar9) = uVar7;
          snprintf((char *)local_238,0x100,"l%d_rolling_variance",uVar17 & 0xffffffff);
          uVar7 = ggml_get_tensor(local_360.ctx,local_238);
          *(undefined8 *)
           ((long)&(local_360.conv2d_layers.
                    super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                    super__Vector_impl_data._M_start)->rolling_variance + lVar9) = uVar7;
        }
        uVar17 = uVar17 + 1;
        lVar9 = lVar9 + 0x30;
      } while ((long)uVar17 <
               (long)((int)((ulong)((long)local_360.conv2d_layers.
                                          super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_360.conv2d_layers.
                                         super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555));
    }
  }
  if (lVar6 == 0) {
    main_cold_6();
    iVar15 = 1;
    goto LAB_00105b8a;
  }
  local_2e0.w = 0;
  local_2e0.h = 0;
  local_2e0._8_8_ = local_2e0._8_8_ & 0xffffffff00000000;
  local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = load_image(local_2b8.fname_inp._M_dataplus._M_p,&local_2e0);
  if (bVar2) {
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::ifstream::ifstream((istream *)local_238,"data/coco.names",_S_in);
    uVar5 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] - 0x18));
    if ((uVar5 & 5) == 0) {
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity =
           local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] - 0x18) +
                                (char)(istream *)local_238);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_328,cVar3);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2f8,&local_328);
      }
      if ((long)local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0xa00) {
        uVar7 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/yolo/yolov3-tiny.cpp"
                           ,0xb2,"GGML_ASSERT(%s) failed","labels.size() == 80");
        std::vector<yolo_image,_std::allocator<yolo_image>_>::~vector
                  ((vector<yolo_image,_std::allocator<yolo_image>_> *)&local_328);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        if (local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e0.data.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e0.data.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        yolo_params::~yolo_params(&local_2b8);
        if (local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
            _M_impl.super__Vector_impl_data._M_start != (conv2d_layer *)0x0) {
          operator_delete(local_360.conv2d_layers.
                          super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_360.conv2d_layers.
                                super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_360.conv2d_layers.
                                super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_238);
      if ((uVar5 & 5) != 0) goto LAB_00105c69;
      local_328._M_dataplus._M_p = (pointer)0x0;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity = 0;
      std::vector<yolo_image,_std::allocator<yolo_image>_>::resize
                ((vector<yolo_image,_std::allocator<yolo_image>_> *)&local_328,0x400);
      local_300 = 0x500;
      local_308 = 0;
      uVar17 = 0;
      do {
        uVar16 = 0x20;
        bVar2 = false;
        lVar6 = local_300;
        do {
          uVar14 = uVar16 & 0xffffffff;
          snprintf((char *)local_238,0x100,"data/labels/%d_%d.png",uVar14,uVar17 & 0xffffffff);
          bVar4 = load_image((char *)local_238,(yolo_image *)(local_328._M_dataplus._M_p + lVar6));
          if (!bVar4) {
            fprintf(_stderr,"Cannot load \'%s\'\n",local_238);
            if (!bVar2) goto LAB_00105470;
            break;
          }
          bVar2 = 0x7d < uVar16;
          uVar16 = uVar16 + 1;
          lVar6 = lVar6 + 0x28;
        } while (uVar16 != 0x7f);
        bVar2 = 6 < uVar17;
        uVar17 = uVar17 + 1;
        local_308 = CONCAT71((int7)(uVar14 >> 8),bVar2);
        local_300 = local_300 + 0x1400;
      } while (uVar17 != 8);
LAB_00105470:
      if ((local_308 & 1) == 0) {
        main_cold_4();
LAB_00105c8c:
        iVar15 = 1;
      }
      else {
        lVar6 = ggml_tensor_overhead();
        local_250 = ggml_graph_overhead();
        local_250 = local_250 + lVar6 * 0x800;
        uStack_248 = 0;
        local_240 = 1;
        uVar7 = CONCAT71(uStack_23f,1);
        uStack_248._0_4_ = 0;
        uVar18 = (undefined4)local_250;
        uVar19 = (undefined4)uStack_248;
        ctx = (ggml_context *)ggml_init();
        gf = (ggml_cgraph *)ggml_new_graph(ctx);
        pgVar11 = (ggml_tensor *)
                  ggml_new_tensor_4d(ctx,0,(long)local_360.width,(long)local_360.height,3,1,uVar18,
                                     uVar19,uVar7);
        ggml_set_name(pgVar11,"input");
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",1,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",2,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",3,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",4,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",5,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 3);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",6,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",7,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",8,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar12 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",9,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 5);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",10,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        pgVar12 = (ggml_tensor *)ggml_pool_2d(0x3f000000,0x3f000000,ctx,pgVar12,0,2,2,1,1);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0xb,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 6);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0xc,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 7);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0xd,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        pgVar13 = apply_conv2d(ctx,pgVar12,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 8);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0xe,(ulong)(uint)pgVar13->ne[0],
               (ulong)(uint)pgVar13->ne[1],(ulong)(uint)pgVar13->ne[2],(ulong)(uint)pgVar13->ne[3]);
        pgVar13 = apply_conv2d(ctx,pgVar13,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 9);
        ggml_set_output(pgVar13);
        ggml_set_name(pgVar13,"layer_15");
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0xf,(ulong)(uint)pgVar13->ne[0],
               (ulong)(uint)pgVar13->ne[1],(ulong)(uint)pgVar13->ne[2],(ulong)(uint)pgVar13->ne[3]);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 10);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0x12,(ulong)(uint)pgVar12->ne[0],
               (ulong)(uint)pgVar12->ne[1],(ulong)(uint)pgVar12->ne[2],(ulong)(uint)pgVar12->ne[3]);
        lVar6 = ggml_upscale(ctx,pgVar12,2,0);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0x13,
               (ulong)*(uint *)(lVar6 + 0x10),(ulong)*(uint *)(lVar6 + 0x18),
               (ulong)*(uint *)(lVar6 + 0x20),(ulong)*(uint *)(lVar6 + 0x28));
        pgVar11 = (ggml_tensor *)ggml_concat(ctx,lVar6,pgVar11,2);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0x14,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0xb);
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0x15,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               local_360.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0xc);
        ggml_set_output(pgVar11);
        ggml_set_name(pgVar11,"layer_22");
        printf("Layer %2d output shape:  %3d x %3d x %4d x %3d\n",0x16,(ulong)(uint)pgVar11->ne[0],
               (ulong)(uint)pgVar11->ne[1],(ulong)(uint)pgVar11->ne[2],(ulong)(uint)pgVar11->ne[3]);
        ggml_build_forward_expand(gf,pgVar13);
        ggml_build_forward_expand(gf,pgVar11);
        uVar7 = ggml_backend_get_default_buffer_type(local_360.backend);
        uVar7 = ggml_gallocr_new(uVar7);
        ggml_gallocr_alloc_graph(uVar7,gf);
        lVar6 = ggml_time_ms();
        detect(&local_2e0,gf,&local_360,local_2b8.thresh,&local_2f8,
               (vector<yolo_image,_std::allocator<yolo_image>_> *)&local_328);
        lVar9 = ggml_time_ms();
        bVar2 = save_image(&local_2e0,local_2b8.fname_out._M_dataplus._M_p,0x50);
        if (!bVar2) {
          main_cold_5();
          goto LAB_00105c8c;
        }
        printf("Detected objects saved in \'%s\' (time: %f sec.)\n",
               SUB84((double)((float)(lVar9 - lVar6) / 1000.0),0),
               local_2b8.fname_out._M_dataplus._M_p);
        ggml_free(ctx);
        ggml_gallocr_free(uVar7);
        ggml_free(local_360.ctx);
        ggml_backend_buffer_free(local_360.buffer);
        iVar15 = 0;
        ggml_backend_free(local_360.backend);
      }
      std::vector<yolo_image,_std::allocator<yolo_image>_>::~vector
                ((vector<yolo_image,_std::allocator<yolo_image>_> *)&local_328);
    }
    else {
      std::ifstream::~ifstream(local_238);
LAB_00105c69:
      main_cold_3();
      iVar15 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
  }
  else {
    main_cold_2();
    iVar15 = 1;
  }
  if (local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00105b8a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.fname_out._M_dataplus._M_p != &local_2b8.fname_out.field_2) {
    operator_delete(local_2b8.fname_out._M_dataplus._M_p,
                    CONCAT17(local_2b8.fname_out.field_2._M_local_buf[7],
                             local_2b8.fname_out.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.fname_inp._M_dataplus._M_p != &local_2b8.fname_inp.field_2) {
    operator_delete(local_2b8.fname_inp._M_dataplus._M_p,
                    local_2b8.fname_inp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.model._M_dataplus._M_p != &local_2b8.model.field_2) {
    operator_delete(local_2b8.model._M_dataplus._M_p,
                    local_2b8.model.field_2._M_allocated_capacity + 1);
  }
  if (local_360.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
      _M_impl.super__Vector_impl_data._M_start != (conv2d_layer *)0x0) {
    operator_delete(local_360.conv2d_layers.
                    super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_360.conv2d_layers.
                          super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_360.conv2d_layers.
                          super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar15;
}

Assistant:

int main(int argc, char *argv[])
{
    ggml_time_init();
    yolo_model model;

    yolo_params params;
    if (!yolo_params_parse(argc, argv, params)) {
        return 1;
    }
    if (!load_model(params.model, model)) {
        fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
        return 1;
    }
    yolo_image img(0,0,0);
    if (!load_image(params.fname_inp.c_str(), img)) {
        fprintf(stderr, "%s: failed to load image from '%s'\n", __func__, params.fname_inp.c_str());
        return 1;
    }
    std::vector<std::string> labels;
    if (!load_labels("data/coco.names", labels)) {
        fprintf(stderr, "%s: failed to load labels from 'data/coco.names'\n", __func__);
        return 1;
    }
    std::vector<yolo_image> alphabet;
    if (!load_alphabet(alphabet)) {
        fprintf(stderr, "%s: failed to load alphabet\n", __func__);
        return 1;
    }

    struct ggml_init_params params0 = {
        /*.mem_size   =*/ ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead(),
        /*.mem_buffer =*/ NULL,
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };
    struct ggml_context * ctx_cgraph = ggml_init(params0);
    struct ggml_cgraph * gf = build_graph(ctx_cgraph, model);

    ggml_gallocr_t allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));
    ggml_gallocr_alloc_graph(allocr, gf);

    const int64_t t_start_ms = ggml_time_ms();
    detect(img, gf, model, params.thresh, labels, alphabet);
    const int64_t t_detect_ms = ggml_time_ms() - t_start_ms;
    if (!save_image(img, params.fname_out.c_str(), 80)) {
        fprintf(stderr, "%s: failed to save image to '%s'\n", __func__, params.fname_out.c_str());
        return 1;
    }
    printf("Detected objects saved in '%s' (time: %f sec.)\n", params.fname_out.c_str(), t_detect_ms / 1000.0f);

    ggml_free(ctx_cgraph);
    ggml_gallocr_free(allocr);
    ggml_free(model.ctx);
    ggml_backend_buffer_free(model.buffer);
    ggml_backend_free(model.backend);
    return 0;
}